

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi-timeout.c
# Opt level: O0

void lws_sul_wsitimeout_cb(lws_sorted_usec_list_t *sul)

{
  char cVar1;
  sul_cb_t p_Var2;
  lws *wsi_00;
  lws_context_per_thread *pt;
  lws *wsi;
  lws_sorted_usec_list_t *sul_local;
  
  wsi_00 = (lws *)(sul + -6);
  p_Var2 = sul[6].cb;
  cVar1 = *(char *)((long)&sul[0xc].cb + 5);
  if (*(char *)((long)&sul[0xc].cb + 4) != ' ') {
    lws_stats_bump((lws_context_per_thread *)(p_Var2 + (long)(int)cVar1 * 0x188 + 0x180),0xd,1);
  }
  if (*(char *)((long)&sul[0xc].cb + 4) != ' ') {
    _lws_log(8,"wsi %p: TIMEDOUT WAITING on %d (did hdr %d, ah %p, wl %d)\n",wsi_00,
             (ulong)(uint)(int)*(char *)((long)&sul[0xc].cb + 4),
             (ulong)((uint)*(undefined8 *)((long)&sul[0xc].list.next + 4) & 1),sul[-6].us,
             (((lws_context_per_thread *)(p_Var2 + (long)(int)cVar1 * 0x188 + 0x180))->http).
             ah_wait_list_length);
  }
  if (*(char *)((long)&sul[0xc].cb + 4) != '\x0f') {
    *(ulong *)((long)&sul[0xc].list.next + 4) =
         *(ulong *)((long)&sul[0xc].list.next + 4) & 0xffffffffffffefff | 0x1000;
  }
  if (((ulong)sul[0xb].cb & 0xffff00000000) == 0x20400000000) {
    lws_inform_client_conn_fail(wsi_00,"Timed out waiting SSL",0x15);
  }
  __lws_close_free_wsi(wsi_00,LWS_CLOSE_STATUS_NOSTATUS,"timeout");
  return;
}

Assistant:

static void
lws_sul_wsitimeout_cb(lws_sorted_usec_list_t *sul)
{
	struct lws *wsi = lws_container_of(sul, struct lws, sul_timeout);
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];

	if (wsi->pending_timeout != PENDING_TIMEOUT_USER_OK)
		lws_stats_bump(pt, LWSSTATS_C_TIMEOUTS, 1);

	/* no need to log normal idle keepalive timeout */
//		if (wsi->pending_timeout != PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE)
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	if (wsi->pending_timeout != PENDING_TIMEOUT_USER_OK)
		lwsl_info("wsi %p: TIMEDOUT WAITING on %d "
			  "(did hdr %d, ah %p, wl %d)\n",
			  (void *)wsi, wsi->pending_timeout,
			  wsi->hdr_parsing_completed, wsi->http.ah,
			  pt->http.ah_wait_list_length);
#if defined(LWS_WITH_CGI)
	if (wsi->http.cgi)
		lwsl_notice("CGI timeout: %s\n", wsi->http.cgi->summary);
#endif
#else
	if (wsi->pending_timeout != PENDING_TIMEOUT_USER_OK)
		lwsl_info("wsi %p: TIMEDOUT WAITING on %d ", (void *)wsi,
				wsi->pending_timeout);
#endif
	/* cgi timeout */
	if (wsi->pending_timeout != PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE)
		/*
		 * Since he failed a timeout, he already had a chance to
		 * do something and was unable to... that includes
		 * situations like half closed connections.  So process
		 * this "failed timeout" close as a violent death and
		 * don't try to do protocol cleanup like flush partials.
		 */
		wsi->socket_is_permanently_unusable = 1;
#if defined(LWS_WITH_CLIENT)
	if (lwsi_state(wsi) == LRS_WAITING_SSL)
		lws_inform_client_conn_fail(wsi,
			(void *)"Timed out waiting SSL", 21);
#endif

	__lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "timeout");
}